

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkIoArraysConsistency(TParseContext *this,TSourceLoc *loc,bool tailOnly)

{
  bool bVar1;
  undefined4 requiredSize_00;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference ppTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *feature;
  undefined4 extraout_var_01;
  TType *type;
  size_type sStack_58;
  bool firstIteration;
  size_t i;
  size_t listSize;
  TString featureString;
  int requiredSize;
  bool tailOnly_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  featureString.field_2._8_4_ = 0;
  featureString.field_2._M_local_buf[0xf] = tailOnly;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &listSize);
  sVar4 = std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::size
                    (&(this->ioArraySymbolResizeList).
                      super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                    );
  sStack_58 = 0;
  if ((featureString.field_2._M_local_buf[0xf] & 1U) != 0) {
    sStack_58 = sVar4 - 1;
  }
  bVar1 = true;
  for (; sStack_58 < sVar4; sStack_58 = sStack_58 + 1) {
    ppTVar5 = std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::
              operator[](&(this->ioArraySymbolResizeList).
                          super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                         ,sStack_58);
    iVar2 = (*(*ppTVar5)->_vptr_TSymbol[0xd])();
    if ((bVar1) || ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh)) {
      iVar3 = (*((TType *)CONCAT44(extraout_var,iVar2))->_vptr_TType[10])();
      featureString.field_2._8_4_ =
           getIoArrayImplicitSize
                     (this,(TQualifier *)CONCAT44(extraout_var_00,iVar3),(TString *)&listSize);
      if (featureString.field_2._8_4_ == 0) break;
      bVar1 = false;
    }
    requiredSize_00 = featureString.field_2._8_4_;
    feature = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&listSize);
    ppTVar5 = std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::
              operator[](&(this->ioArraySymbolResizeList).
                          super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                         ,sStack_58);
    iVar3 = (*(*ppTVar5)->_vptr_TSymbol[3])();
    checkIoArrayConsistency
              (this,loc,requiredSize_00,feature,(TType *)CONCAT44(extraout_var,iVar2),
               (TString *)CONCAT44(extraout_var_01,iVar3));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                &listSize);
  return;
}

Assistant:

void TParseContext::checkIoArraysConsistency(const TSourceLoc &loc, bool tailOnly)
{
    int requiredSize = 0;
    TString featureString;
    size_t listSize = ioArraySymbolResizeList.size();
    size_t i = 0;

    // If tailOnly = true, only check the last array symbol in the list.
    if (tailOnly) {
        i = listSize - 1;
    }
    for (bool firstIteration = true; i < listSize; ++i) {
        TType &type = ioArraySymbolResizeList[i]->getWritableType();

        // As I/O array sizes don't change, fetch requiredSize only once,
        // except for mesh shaders which could have different I/O array sizes based on type qualifiers.
        if (firstIteration || (language == EShLangMesh)) {
            requiredSize = getIoArrayImplicitSize(type.getQualifier(), &featureString);
            if (requiredSize == 0)
                break;
            firstIteration = false;
        }

        checkIoArrayConsistency(loc, requiredSize, featureString.c_str(), type,
                                ioArraySymbolResizeList[i]->getName());
    }
}